

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcie_cfg_write.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  nettlp_pcie_cfg *__buf;
  char *__s;
  uint16_t addr;
  uint32_t data;
  nettlp_pcie_cfg ntpc;
  uint16_t local_4a;
  undefined4 local_48;
  uint local_44;
  nettlp_pcie_cfg local_40;
  
  local_4a = 0;
  local_48 = 0;
  local_40.sockfd = 0;
  local_40.remote_addr.s_addr = 0;
  local_40.local_addr.s_addr = 0;
  uVar2 = 0;
  do {
    while( true ) {
      while (local_44 = uVar2, iVar1 = getopt(argc,argv,"r:l:a:d:s:h"), iVar1 < 0x6c) {
        if (iVar1 == 0x61) {
          iVar1 = __isoc99_sscanf(_optarg,"0x%hx",&local_4a);
          uVar2 = local_44;
          if (iVar1 < 1) {
            main_cold_3();
            return -1;
          }
        }
        else {
          if (iVar1 != 100) {
            if (iVar1 == -1) {
              iVar1 = nettlp_pcie_cfg_init(&local_40);
              if (iVar1 < 0) {
                __s = "nettlp_pcie_cfg_init";
              }
              else {
                sVar3 = nettlp_pcie_cfg_write(&local_40,local_4a,&local_48,(ulong)local_44);
                if (-1 < (int)sVar3) {
                  return 0;
                }
                __s = "nettlp_pcie_cfg_write";
              }
              goto LAB_00102451;
            }
            goto LAB_00102413;
          }
          iVar1 = __isoc99_sscanf(_optarg,"0x%x",&local_48);
          uVar2 = local_44;
          if (iVar1 < 1) {
            main_cold_2();
            return -1;
          }
        }
      }
      __buf = (nettlp_pcie_cfg *)&local_40.local_addr;
      if ((iVar1 != 0x6c) && (__buf = &local_40, iVar1 != 0x72)) break;
      iVar1 = inet_pton(2,_optarg,__buf);
      uVar2 = local_44;
      if (iVar1 < 1) {
        __s = "inet_pton";
LAB_00102451:
        perror(__s);
        return -1;
      }
    }
    if (iVar1 != 0x73) {
LAB_00102413:
      puts(
          "usage\n    -r remote addr\n    -l local addr\n    -a 0xXX (hex), target addr in PCIe configuration space\n    -d 0xXX (hex) data to be written\n    -s size in bytes"
          );
      return -1;
    }
    uVar2 = atoi(_optarg);
    if (4 < uVar2) {
      main_cold_1();
      return -1;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch;
	int size = 0;
	uint16_t addr = 0;
	uint32_t data = 0;
	struct nettlp_pcie_cfg ntpc;

	memset(&ntpc, 0, sizeof(ntpc));

	while ((ch = getopt(argc, argv, "r:l:a:d:s:h")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &ntpc.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &ntpc.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'a':
			ret = sscanf(optarg, "0x%hx", &addr);
			if (ret < 1) {
				fprintf(stderr, "invalid address\n");
				return -1;
			}
			break;
				
		case 'd':
			ret = sscanf(optarg, "0x%x", &data);
			if (ret < 1) {
				fprintf(stderr, "invalid data\n");
				return -1;
			}
			break;

		case 's':
			size = atoi(optarg);
			if (size < 0 || size > 4) {
				fprintf(stderr, "invalid size\n");
				return -1;
			}
			break;

		case 'h':
		default:
			usage();
			return -1;
		}
	}

	ret = nettlp_pcie_cfg_init(&ntpc);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_init");
		return -1;
	}

	ret = nettlp_pcie_cfg_write(&ntpc, addr, &data, size);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_write");
		return -1;
	}
	
	return 0;
}